

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O0

void __thiscall vkb::Result<vkb::SystemInfo>::destroy(Result<vkb::SystemInfo> *this)

{
  Result<vkb::SystemInfo> *this_local;
  
  if ((this->m_init & 1U) != 0) {
    SystemInfo::~SystemInfo((SystemInfo *)this);
  }
  return;
}

Assistant:

void destroy() {
        if (m_init) m_value.~T();
    }